

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O0

int Smt_PrsCreateNode(Wlc_Ntk_t *pNtk,int Type,int fSigned,int Range,Vec_Int_t *vFanins,char *pName)

{
  int iVar1;
  int Entry;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  Wlc_Obj_t *pWVar6;
  Vec_Int_t *newFanins;
  int iObj3;
  int iObj2;
  int iObj1;
  int range1;
  Vec_Int_t *v2Fanins;
  int iFanin1;
  int iFanin0;
  int iObj;
  int new_size;
  int old_size;
  int fFound;
  int NameId;
  char *pNameFanin;
  char Buffer [100];
  char *pName_local;
  Vec_Int_t *vFanins_local;
  int Range_local;
  int fSigned_local;
  int Type_local;
  Wlc_Ntk_t *pNtk_local;
  
  unique0x10000920 = (char **)pName;
  pVVar5 = Vec_IntStartFull(2);
  if (Type < 1) {
    __assert_fail("Type > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x13b,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
  }
  if (Range < 0) {
    __assert_fail("Range >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x13c,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
  }
  if (fSigned < 0) {
    __assert_fail("fSigned >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x13d,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
  }
  iVar1 = Vec_IntSize(vFanins);
  if ((2 < iVar1) &&
     (((((((Type == 0x10 || (Type == 0x11)) || (Type == 0x12)) ||
         (((Type == 0x13 || (Type == 0x14)) ||
          ((Type == 0x15 || ((Type == 0x1b || (Type == 0x1c)))))))) ||
        ((Type == 0x1d || (((Type == 0x1e || (Type == 0x1f)) || (Type == 0x21)))))) ||
       (((Type == 0x22 || (Type == 0x23)) ||
        (((Type == 0x24 || ((Type == 0x2b || (Type == 0x2c)))) || (Type == 0x2d)))))) ||
      (Type == 0x2e)))) {
    while (iVar1 = Vec_IntSize(vFanins), 2 < iVar1) {
      iVar1 = Vec_IntSize(vFanins);
      iVar2 = Vec_IntPop(vFanins);
      Entry = Vec_IntPop(vFanins);
      Vec_IntWriteEntry(pVVar5,0,iVar2);
      Vec_IntWriteEntry(pVVar5,1,Entry);
      uVar3 = Wlc_ObjAlloc(pNtk,Type,fSigned,Range + -1,0);
      sprintf((char *)&pNameFanin,"_n%d_",(ulong)uVar3);
      _fFound = &pNameFanin;
      old_size = Abc_NamStrFindOrAdd(pNtk->pManName,(char *)_fFound,&new_size);
      if (new_size != 0) {
        __assert_fail("!fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x16b,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      if (uVar3 != old_size) {
        __assert_fail("iObj == NameId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x16c,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      pWVar6 = Wlc_NtkObj(pNtk,uVar3);
      Wlc_ObjAddFanins(pNtk,pWVar6,pVVar5);
      Vec_IntPush(vFanins,uVar3);
      iVar2 = Vec_IntSize(vFanins);
      if (iVar1 <= iVar2) {
        __assert_fail("new_size<old_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x173,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
    }
  }
  Vec_IntFree(pVVar5);
  if (((Type == 9) || (Type == 10)) || (Type == 0xb)) {
    iVar1 = Vec_IntSize(vFanins);
    if (iVar1 < 2) {
      __assert_fail("Vec_IntSize(vFanins)>=2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                    ,0x182,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)")
      ;
    }
    iVar1 = Vec_IntEntry(vFanins,1);
    pWVar6 = Wlc_NtkObj(pNtk,iVar1);
    iVar2 = Wlc_ObjRange(pWVar6);
    if (0x20 < iVar2) {
      pVVar5 = Vec_IntAlloc(10);
      Vec_IntPush(pVVar5,iVar1);
      Vec_IntPushTwo(pVVar5,0x1e,0);
      uVar3 = Wlc_ObjAlloc(pNtk,0x16,0,0x1e,0);
      sprintf((char *)&pNameFanin,"_n%d_",(ulong)uVar3);
      _fFound = &pNameFanin;
      old_size = Abc_NamStrFindOrAdd(pNtk->pManName,(char *)_fFound,&new_size);
      if (new_size != 0) {
        __assert_fail("!fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,400,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)")
        ;
      }
      if (uVar3 != old_size) {
        __assert_fail("iObj1 == NameId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x191,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      pWVar6 = Wlc_NtkObj(pNtk,uVar3);
      Wlc_ObjAddFanins(pNtk,pWVar6,pVVar5);
      Vec_IntPop(pVVar5);
      Vec_IntPop(pVVar5);
      Vec_IntPushTwo(pVVar5,iVar2 + -1,0x1f);
      uVar4 = Wlc_ObjAlloc(pNtk,0x16,0,iVar2 + -1,0x1f);
      sprintf((char *)&pNameFanin,"_n%d_",(ulong)uVar4);
      _fFound = &pNameFanin;
      old_size = Abc_NamStrFindOrAdd(pNtk->pManName,(char *)_fFound,&new_size);
      if (new_size != 0) {
        __assert_fail("!fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x1a0,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      if (uVar4 != old_size) {
        __assert_fail("iObj2 == NameId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x1a1,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      pWVar6 = Wlc_NtkObj(pNtk,uVar4);
      Wlc_ObjAddFanins(pNtk,pWVar6,pVVar5);
      Vec_IntPop(pVVar5);
      Vec_IntPop(pVVar5);
      Vec_IntWriteEntry(pVVar5,0,uVar4);
      uVar4 = Wlc_ObjAlloc(pNtk,0x26,0,0,0);
      sprintf((char *)&pNameFanin,"_n%d_",(ulong)uVar4);
      _fFound = &pNameFanin;
      old_size = Abc_NamStrFindOrAdd(pNtk->pManName,(char *)_fFound,&new_size);
      if (new_size != 0) {
        __assert_fail("!fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x1af,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      if (uVar4 != old_size) {
        __assert_fail("iObj3 == NameId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x1b0,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      pWVar6 = Wlc_NtkObj(pNtk,uVar4);
      Wlc_ObjAddFanins(pNtk,pWVar6,pVVar5);
      Vec_IntWriteEntry(pVVar5,0,uVar4);
      Vec_IntPush(pVVar5,uVar3);
      uVar3 = Wlc_ObjAlloc(pNtk,0x17,0,0x1f,0);
      sprintf((char *)&pNameFanin,"_n%d_",(ulong)uVar3);
      _fFound = &pNameFanin;
      old_size = Abc_NamStrFindOrAdd(pNtk->pManName,(char *)_fFound,&new_size);
      if (new_size != 0) {
        __assert_fail("!fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x1bd,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      if (uVar3 != old_size) {
        __assert_fail("iObj == NameId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                      ,0x1be,
                      "int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
      }
      pWVar6 = Wlc_NtkObj(pNtk,uVar3);
      Wlc_ObjAddFanins(pNtk,pWVar6,pVVar5);
      Vec_IntWriteEntry(vFanins,1,uVar3);
      Vec_IntFree(pVVar5);
    }
  }
  uVar3 = Wlc_ObjAlloc(pNtk,Type,fSigned,Range + -1,0);
  if (stack0xffffffffffffffd0 == (char **)0x0) {
    sprintf((char *)&pNameFanin,"_n%d_",(ulong)uVar3);
    unique0x00004880 = &pNameFanin;
  }
  old_size = Abc_NamStrFindOrAdd(pNtk->pManName,(char *)stack0xffffffffffffffd0,&new_size);
  if (new_size != 0) {
    __assert_fail("!fFound",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x1d2,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
  }
  if (uVar3 != old_size) {
    __assert_fail("iObj == NameId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x1d3,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
  }
  pWVar6 = Wlc_NtkObj(pNtk,uVar3);
  Wlc_ObjAddFanins(pNtk,pWVar6,vFanins);
  if (fSigned != 0) {
    pWVar6 = Wlc_NtkObj(pNtk,uVar3);
    *(ushort *)pWVar6 = *(ushort *)pWVar6 & 0xffbf | ((ushort)fSigned & 1) << 6;
  }
  return uVar3;
}

Assistant:

static inline int Smt_PrsCreateNode( Wlc_Ntk_t * pNtk, int Type, int fSigned, int Range, Vec_Int_t * vFanins, char * pName )
{
    char Buffer[100];
    char * pNameFanin;
    int NameId, fFound, old_size, new_size;
    int iObj, iFanin0, iFanin1; 
    Vec_Int_t * v2Fanins = Vec_IntStartFull(2);
    
    assert( Type > 0 );
    assert( Range >= 0 );
    assert( fSigned >= 0 );
    
    //if (Vec_IntSize(vFanins)<=2 || Type == WLC_OBJ_BIT_CONCAT || Type == WLC_OBJ_MUX )
    // explicitely secify allowed multi operators
    if (Vec_IntSize(vFanins)<=2 || 
        !( Type == WLC_OBJ_BIT_AND ||       // 16:`` bitwise AND
          Type == WLC_OBJ_BIT_OR ||        // 17: bitwise OR
          Type == WLC_OBJ_BIT_XOR ||       // 18: bitwise XOR
          Type == WLC_OBJ_BIT_NAND ||      // 19: bitwise AND
          Type == WLC_OBJ_BIT_NOR ||       // 20: bitwise OR
          Type == WLC_OBJ_BIT_NXOR ||      // 21: bitwise NXOR

          Type == WLC_OBJ_LOGIC_IMPL ||    // 27: logic implication
          Type == WLC_OBJ_LOGIC_AND ||     // 28: logic AND
          Type == WLC_OBJ_LOGIC_OR ||      // 29: logic OR
          Type == WLC_OBJ_LOGIC_XOR ||     // 30: logic XOR
          Type == WLC_OBJ_COMP_EQU ||      // 31: compare equal
//          Type == WLC_OBJ_COMP_NOTEQU ||   // 32: compare not equal -- bug fix
          Type == WLC_OBJ_COMP_LESS ||     // 33: compare less
          Type == WLC_OBJ_COMP_MORE ||     // 34: compare more
          Type == WLC_OBJ_COMP_LESSEQU ||  // 35: compare less or equal
          Type == WLC_OBJ_COMP_MOREEQU || // 36: compare more or equal

          Type == WLC_OBJ_ARI_ADD ||       // 43: arithmetic addition
          Type == WLC_OBJ_ARI_SUB ||       // 44: arithmetic subtraction
          Type == WLC_OBJ_ARI_MULTI ||     // 45: arithmetic multiplier
          Type == WLC_OBJ_ARI_DIVIDE       // 46: arithmetic division 
        ))
        goto FINISHED_WITH_FANINS;

    // we will be creating nodes backwards. this way we can pop from vFanins easier
    while (Vec_IntSize(vFanins)>2)
    {
        // getting 2 fanins at a time
        old_size = Vec_IntSize(vFanins);
        iFanin0 = Vec_IntPop(vFanins);
        iFanin1 = Vec_IntPop(vFanins);
        
        Vec_IntWriteEntry(v2Fanins,0,iFanin0);
        Vec_IntWriteEntry(v2Fanins,1,iFanin1);
        
        iObj = Wlc_ObjAlloc( pNtk, Type, fSigned, Range-1, 0 );
        sprintf( Buffer, "_n%d_", iObj );
        pNameFanin = Buffer;
        NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pNameFanin, &fFound );
        
        assert( !fFound );
        assert( iObj == NameId );
        
        Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj), v2Fanins );
        
        // pushing the new node
        Vec_IntPush(vFanins, iObj);
        new_size = Vec_IntSize(vFanins);
        assert(new_size<old_size);
    }
    
FINISHED_WITH_FANINS:

    Vec_IntFree(v2Fanins);
    
    //added to deal with long shifts create extra bit select (ROTATE as well ??)
    // this is a temporary hack
    // basically we keep only 32 bits. 
    // bit[31] will be the copy of original MSB (sign bit, just in case) UPDATE: assume it is unsigned first????
    // bit[31] will be the reduction or of any bits from [31] to Range
    if (Type == WLC_OBJ_SHIFT_R || Type == WLC_OBJ_SHIFT_RA || Type == WLC_OBJ_SHIFT_L)
    {
        int range1, iObj1, iObj2, iObj3;
        assert(Vec_IntSize(vFanins)>=2);
        iFanin1 = Vec_IntEntry(vFanins,1);
        range1 = Wlc_ObjRange( Wlc_NtkObj(pNtk, iFanin1) );
        if (range1>32)
        {
            Vec_Int_t * newFanins = Vec_IntAlloc(10);
            Vec_IntPush(newFanins,iFanin1);
            Vec_IntPushTwo( newFanins, 30, 0 );
            
            iObj1 = Wlc_ObjAlloc( pNtk, WLC_OBJ_BIT_SELECT, 0, 30, 0 );
            sprintf( Buffer, "_n%d_", iObj1 );
            pNameFanin = Buffer;
            NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pNameFanin, &fFound );
        
            assert( !fFound );
            assert( iObj1 == NameId );
        
            Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj1), newFanins );
            
            //printf("obj1: %d\n",iObj1);
            
            // bit select of larger bits
            Vec_IntPop(newFanins);
            Vec_IntPop(newFanins);
            Vec_IntPushTwo( newFanins, range1-1, 31 );
            iObj2 = Wlc_ObjAlloc( pNtk, WLC_OBJ_BIT_SELECT, 0, range1-1, 31 );
            sprintf( Buffer, "_n%d_", iObj2 );
            pNameFanin = Buffer;
            NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pNameFanin, &fFound );
        
            assert( !fFound );
            assert( iObj2 == NameId );
        
            Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj2), newFanins );
            //printf("obj2: %d\n",iObj2);
            
            // reduction or
            Vec_IntPop( newFanins );
            Vec_IntPop( newFanins );
            Vec_IntWriteEntry( newFanins, 0, iObj2 );
            iObj3 = Wlc_ObjAlloc( pNtk, WLC_OBJ_REDUCT_OR, 0, 0, 0 );
            sprintf( Buffer, "_n%d_", iObj3 );
            pNameFanin = Buffer;
            NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pNameFanin, &fFound );
        
            assert( !fFound );
            assert( iObj3 == NameId );
        
            Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj3), newFanins );
            //printf("obj3: %d\n",iObj3);
        
            // concat all together
            Vec_IntWriteEntry( newFanins, 0, iObj3 );
            Vec_IntPush( newFanins, iObj1 );
            iObj = Wlc_ObjAlloc( pNtk, WLC_OBJ_BIT_CONCAT, 0, 31, 0 );
            sprintf( Buffer, "_n%d_", iObj );
            pNameFanin = Buffer;
            NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pNameFanin, &fFound );
        
            assert( !fFound );
            assert( iObj == NameId );
        
            Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj), newFanins );
            //printf("obj: %d\n",iObj);
        
            // pushing the new node
            Vec_IntWriteEntry(vFanins, 1, iObj);
            Vec_IntFree(newFanins);
        }
    }
    
    iObj = Wlc_ObjAlloc( pNtk, Type, fSigned, Range-1, 0 );
    
    // add node's name
    if ( pName == NULL )
    {
        sprintf( Buffer, "_n%d_", iObj );
        pName = Buffer;
    }
    NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pName, &fFound );
    assert( !fFound );
    assert( iObj == NameId );
    
    Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj), vFanins );
    if ( fSigned )
    {
        Wlc_NtkObj(pNtk, iObj)->Signed = fSigned;
//        if ( Vec_IntSize(vFanins) > 0 )
//            Wlc_NtkObj(pNtk, Vec_IntEntry(vFanins, 0))->Signed = fSigned;
//        if ( Vec_IntSize(vFanins) > 1 )
//            Wlc_NtkObj(pNtk, Vec_IntEntry(vFanins, 1))->Signed = fSigned;
    }
        
    return iObj;
}